

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_detail.h
# Opt level: O0

void __thiscall
st_tree::detail::max_maintainer<unsigned_long,_std::allocator<str1>_>::erase
          (max_maintainer<unsigned_long,_std::allocator<str1>_> *this,
          max_maintainer<unsigned_long,_std::allocator<str1>_> *src,unsigned_long *d)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  bool bVar5;
  size_type local_30;
  size_type s;
  size_type n;
  unsigned_long *d_local;
  max_maintainer<unsigned_long,_std::allocator<str1>_> *src_local;
  max_maintainer<unsigned_long,_std::allocator<str1>_> *this_local;
  
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&src->_hist);
  if ((sVar2 != 0) && (s = src->_max, *d <= this->_max)) {
    if (this->_max - *d < s) {
      s = this->_max - *d;
    }
    for (local_30 = 0; local_30 <= s; local_30 = local_30 + 1) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&src->_hist,local_30);
      vVar1 = *pvVar3;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->_hist,local_30 + *d);
      *pvVar4 = *pvVar4 - vVar1;
    }
    while( true ) {
      bVar5 = false;
      if (this->_max != 0) {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->_hist,this->_max);
        bVar5 = *pvVar4 == 0;
      }
      if (!bVar5) break;
      this->_max = this->_max - 1;
    }
  }
  return;
}

Assistant:

void erase(const max_maintainer& src, const Unsigned& d) {
        if (src._hist.size() <= 0) return;
        size_type n = src._max;
        if (d > _max) return;
        if ((_max-d) < n) n = _max-d;
        for (size_type s = 0;  s <= n;  ++s) _hist[s + d] -= src._hist[s];
        while ((_max > 0) && (_hist[_max] <= 0)) _max -= 1;
    }